

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O2

bool __thiscall
btLemkeAlgorithm::validBasis(btLemkeAlgorithm *this,btAlignedObjectArray<int> *basis)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = basis->m_size;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar2;
    if (uVar3 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while (SBORROW4(basis->m_data[uVar4],uVar1 * 2) != (int)(basis->m_data[uVar4] + uVar1 * -2) < 0)
  ;
  return (long)(int)uVar1 <= (long)uVar4;
}

Assistant:

bool btLemkeAlgorithm::validBasis(const btAlignedObjectArray<int>& basis) 
  {
    bool isValid = true;
    for (int i = 0; i < basis.size(); i++) {
      if (basis[i] >= basis.size() * 2) { //then z0 is in the base
        isValid = false;
        break;
      }
    }

    return isValid;
  }